

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellUtilityTest.cpp
# Opt level: O3

string * anon_unknown.dwarf_598a6::quoted(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  undefined8 uVar2;
  string *psVar3;
  string *extraout_RAX;
  string *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string quote;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\'","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)local_70,local_50,local_48 + (long)local_50);
  std::__cxx11::string::_M_append((char *)local_70,(ulong)(s->_M_dataplus)._M_p);
  psVar3 = (string *)std::__cxx11::string::_M_append((char *)local_70,(ulong)local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  paVar4 = &psVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar4) {
    uVar2 = *(undefined8 *)((long)&psVar3->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = psVar3->_M_string_length;
  (psVar3->_M_dataplus)._M_p = (pointer)paVar4;
  psVar3->_M_string_length = 0;
  (psVar3->field_2)._M_local_buf[0] = '\0';
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
    psVar3 = extraout_RAX;
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
    psVar3 = extraout_RAX_00;
  }
  return psVar3;
}

Assistant:

std::string quoted(std::string s) {
#if defined(_WIN32)
  std::string quote = "\"";
#else
  std::string quote = "'";
#endif
  return quote + s + quote;
}